

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O1

size_t absl::lts_20250127::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::internal::DescriptorTable_const*>
                 (void *fn,void *slot)

{
  char *__s;
  size_t sVar1;
  uint64_t uVar2;
  ulong uVar3;
  uchar *bytes;
  uint64_t v;
  
  __s = *(char **)(*slot + 0x10);
  sVar1 = strlen(__s);
  uVar2 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,__s,sVar1);
  uVar3 = (uVar2 ^ sVar1) * -0x234dd359734ecb13;
  return uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}